

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_construct_destruct_valid_fn(int _i)

{
  void *dynArray;
  char *pcVar1;
  char *expr;
  int line;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  
  dynArray = private_ACUtils_ADynArray_construct(1);
  lVar4 = *(long *)((long)dynArray + 0x18);
  if (lVar4 == 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x34);
    lVar4 = *(long *)((long)dynArray + 0x20);
    if (lVar4 == 8) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x35);
      if (*(long *)((long)dynArray + 0x28) == 0) {
        lVar4 = 0;
        pcVar5 = (char *)0x0;
        expr = "Assertion \'_ck_x != NULL\' failed";
        pcVar1 = "Assertion \'%s\' failed: %s == %#x";
        pcVar2 = "(void*) array->buffer != NULL";
        pcVar3 = "(void*) array->buffer";
        line = 0x36;
      }
      else {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x36);
        if (*(long *)((long)dynArray + 0x10) != 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x37);
          private_ACUtils_ADynArray_destruct(dynArray);
          return;
        }
        lVar4 = 0;
        pcVar5 = (char *)0x0;
        expr = "Assertion \'_ck_x != NULL\' failed";
        pcVar1 = "Assertion \'%s\' failed: %s == %#x";
        pcVar2 = "(void*) array->growStrategy != NULL";
        pcVar3 = "(void*) array->growStrategy";
        line = 0x37;
      }
    }
    else {
      pcVar5 = "private_ACUtilsTest_ADynArray_capacityMin";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar2 = "array->capacity == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar3 = "array->capacity";
      line = 0x35;
    }
  }
  else {
    pcVar5 = "0";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar2 = "array->size == 0";
    pcVar3 = "array->size";
    line = 0x34;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar1,pcVar2,pcVar3,lVar4,pcVar5);
}

Assistant:

START_TEST(test_ADynArray_construct_destruct_valid)
{
    struct private_ACUtilsTest_ADynArray_CharArray *array;
    array = ADynArray_construct(struct private_ACUtilsTest_ADynArray_CharArray);
    ACUTILSTEST_ASSERT_UINT_EQ(array->size, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(array->capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->growStrategy);
    ADynArray_destruct(array);
}